

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
          (DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
           *this,string_view searchValue)

{
  bool bVar1;
  StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_> *in_RSI;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *in_RDI;
  iterator fnd;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff98;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *this_00;
  StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x27af45);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
              (in_stack_ffffffffffffffc0);
  }
  else {
    StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::begin(in_RSI);
    std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>
                  *)0x27af8d);
    BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::operator+
              (this_00,(ptrdiff_t *)in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

auto find(std::string_view searchValue)
        {
            auto fnd = lookup1.find(searchValue);
            if (fnd != lookup1.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }